

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::UninterpretedOption::ByteSizeLong(UninterpretedOption *this)

{
  uint uVar1;
  long lVar2;
  UnknownFieldSet *unknown_fields;
  Type *value;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  uint i;
  uint uVar6;
  
  uVar6 = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    sVar5 = 0;
  }
  else {
    unknown_fields = UninterpretedOption::unknown_fields(this);
    sVar5 = internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  uVar1 = (this->name_).super_RepeatedPtrFieldBase.current_size_;
  sVar5 = sVar5 + uVar1;
  for (; uVar1 != uVar6; uVar6 = uVar6 + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                      (&(this->name_).super_RepeatedPtrFieldBase,uVar6);
    sVar3 = internal::WireFormatLite::
            MessageSizeNoVirtual<google::protobuf::UninterpretedOption_NamePart>(value);
    sVar5 = sVar5 + sVar3;
  }
  uVar6 = (this->_has_bits_).has_bits_[0];
  if ((uVar6 & 0x3f) != 0) {
    if ((uVar6 & 1) != 0) {
      sVar3 = internal::WireFormatLite::StringSize((this->identifier_value_).ptr_);
      sVar5 = sVar5 + sVar3 + 1;
      uVar6 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar6 & 2) != 0) {
      sVar3 = internal::WireFormatLite::BytesSize((this->string_value_).ptr_);
      sVar5 = sVar5 + sVar3 + 1;
      uVar6 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar6 & 4) != 0) {
      sVar3 = internal::WireFormatLite::StringSize((this->aggregate_value_).ptr_);
      sVar5 = sVar5 + sVar3 + 1;
      uVar6 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar6 & 8) != 0) {
      uVar4 = this->positive_int_value_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar6 & 0x10) != 0) {
      uVar4 = this->negative_int_value_ | 1;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar6 & 0x20) != 0) {
      sVar5 = sVar5 + 9;
    }
  }
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

size_t UninterpretedOption::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.UninterpretedOption)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
  {
    unsigned int count = this->name_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->name(i));
    }
  }

  if (_has_bits_[0 / 32] & 63u) {
    // optional string identifier_value = 3;
    if (has_identifier_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->identifier_value());
    }

    // optional bytes string_value = 7;
    if (has_string_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::BytesSize(
          this->string_value());
    }

    // optional string aggregate_value = 8;
    if (has_aggregate_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->aggregate_value());
    }

    // optional uint64 positive_int_value = 4;
    if (has_positive_int_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt64Size(
          this->positive_int_value());
    }

    // optional int64 negative_int_value = 5;
    if (has_negative_int_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int64Size(
          this->negative_int_value());
    }

    // optional double double_value = 6;
    if (has_double_value()) {
      total_size += 1 + 8;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}